

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhyloTree.cpp
# Opt level: O1

void __thiscall
PhyloTree::PhyloTree
          (PhyloTree *this,vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *edges,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *leaf2NumMap,vector<double,_std::allocator<double>_> *leafEdgeLengths)

{
  (this->newick)._M_dataplus._M_p = (pointer)&(this->newick).field_2;
  (this->newick)._M_string_length = 0;
  (this->newick).field_2._M_local_buf[0] = '\0';
  (this->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->leaf2NumMap).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->leaf2NumMap).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->leaf2NumMap).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->leafEdgeLengths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->leafEdgeLengths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->leafEdgeLengths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::operator=(&this->edges,edges);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->leaf2NumMap,leaf2NumMap);
  std::vector<double,_std::allocator<double>_>::operator=(&this->leafEdgeLengths,leafEdgeLengths);
  return;
}

Assistant:

PhyloTree::PhyloTree(vector<PhyloTreeEdge> &edges, vector<string> &leaf2NumMap, vector<double> &leafEdgeLengths) {
    this->edges = edges;
    this->leaf2NumMap = leaf2NumMap;
    this->leafEdgeLengths = leafEdgeLengths;
}